

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vorbisfile.c
# Opt level: O0

int ov_clear(OggVorbis_File *vf)

{
  int local_14;
  int i;
  OggVorbis_File *vf_local;
  
  if (vf != (OggVorbis_File *)0x0) {
    vorbis_block_clear(&vf->vb);
    vorbis_dsp_clear(&vf->vd);
    ogg_stream_clear(&vf->os);
    if ((vf->vi != (vorbis_info *)0x0) && (vf->links != 0)) {
      for (local_14 = 0; local_14 < vf->links; local_14 = local_14 + 1) {
        vorbis_info_clear(vf->vi + local_14);
        vorbis_comment_clear(vf->vc + local_14);
      }
      free(vf->vi);
      free(vf->vc);
    }
    if (vf->dataoffsets != (ogg_int64_t *)0x0) {
      free(vf->dataoffsets);
    }
    if (vf->pcmlengths != (ogg_int64_t *)0x0) {
      free(vf->pcmlengths);
    }
    if (vf->serialnos != (long *)0x0) {
      free(vf->serialnos);
    }
    if (vf->offsets != (ogg_int64_t *)0x0) {
      free(vf->offsets);
    }
    ogg_sync_clear(&vf->oy);
    if ((vf->datasource != (void *)0x0) && ((vf->callbacks).close_func != (_func_int_void_ptr *)0x0)
       ) {
      (*(vf->callbacks).close_func)(vf->datasource);
    }
    memset(vf,0,0x3b0);
  }
  return 0;
}

Assistant:

int ov_clear(OggVorbis_File *vf){
  if(vf){
    vorbis_block_clear(&vf->vb);
    vorbis_dsp_clear(&vf->vd);
    ogg_stream_clear(&vf->os);

    if(vf->vi && vf->links){
      int i;
      for(i=0;i<vf->links;i++){
        vorbis_info_clear(vf->vi+i);
        vorbis_comment_clear(vf->vc+i);
      }
      _ogg_free(vf->vi);
      _ogg_free(vf->vc);
    }
    if(vf->dataoffsets)_ogg_free(vf->dataoffsets);
    if(vf->pcmlengths)_ogg_free(vf->pcmlengths);
    if(vf->serialnos)_ogg_free(vf->serialnos);
    if(vf->offsets)_ogg_free(vf->offsets);
    ogg_sync_clear(&vf->oy);
    if(vf->datasource && vf->callbacks.close_func)
      (vf->callbacks.close_func)(vf->datasource);
    memset(vf,0,sizeof(*vf));
  }
#ifdef DEBUG_LEAKS
  _VDBG_dump();
#endif
  return(0);
}